

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * __thiscall
soul::getDescriptionOfTimeInSeconds_abi_cxx11_
          (string *__return_storage_ptr__,soul *this,double numSeconds)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  double dStack_18;
  anon_class_1_0_00000001 toStringWithDecPlaces;
  double numSeconds_local;
  
  local_41 = 0;
  dStack_18 = numSeconds;
  if (1.0 <= numSeconds) {
    getDescriptionOfTimeInSeconds[abi:cxx11](double)::$_0::operator()[abi_cxx11_
              (&local_78,&local_19,numSeconds,2);
    std::operator+(__return_storage_ptr__,&local_78," sec");
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    getDescriptionOfTimeInSeconds[abi:cxx11](double)::$_0::operator()[abi_cxx11_
              (&local_40,&local_19,numSeconds * 1000.0,(ulong)(numSeconds < 0.1) + 1);
    local_41 = 1;
    std::operator+(__return_storage_ptr__,&local_40," ms");
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDescriptionOfTimeInSeconds (double numSeconds)
{
    auto toStringWithDecPlaces = [] (double n, size_t numDecPlaces)
    {
        auto s = choc::text::floatToString (n, (int) numDecPlaces);
        auto dot = s.find ('.');
        return dot == std::string::npos ? s : s.substr (0, std::min (s.length(), dot + 1 + numDecPlaces));
    };

    return numSeconds < 1.0 ? (toStringWithDecPlaces (numSeconds * 1000.0, numSeconds < 0.1 ? 2 : 1) + " ms")
                            : (toStringWithDecPlaces (numSeconds, 2) + " sec");
}